

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_boundary_insertion<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
               (void)

{
  R_matrix *this;
  uint uVar1;
  pointer ppVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Column_settings *pCVar26;
  pointer pvVar27;
  Index IVar28;
  Column_zp_settings *this_00;
  _Hash_node_base *p_Var29;
  logic_error *this_01;
  ulong uVar30;
  _Hash_node_base *p_Var31;
  undefined4 local_858;
  int local_854;
  undefined1 *local_850;
  int *local_848;
  undefined **local_840;
  ulong local_838;
  shared_count sStack_830;
  undefined1 **local_828;
  undefined **local_820;
  char *local_818;
  undefined8 *local_810;
  char *local_808;
  undefined **local_800;
  undefined1 local_7f8;
  undefined8 *local_7f0;
  undefined ***local_7e8;
  undefined1 local_7e0 [8];
  undefined8 local_7d8;
  shared_count sStack_7d0;
  char *local_7c8;
  char *local_7c0;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  value_type boundary1;
  value_type boundary2;
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
  m;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>>
            ();
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&boundary2,
           orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  ppVar2 = orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar27 = orderedBoundaries.
            super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar2 != (pointer)0x0) {
    pvVar27 = orderedBoundaries.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar2,(long)(pvVar27->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2)
    ;
    pvVar27 = orderedBoundaries.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar27;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&boundary1,
           orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1);
  ppVar2 = orderedBoundaries.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar27 = orderedBoundaries.
            super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar2 != (pointer)0x0) {
    pvVar27 = orderedBoundaries.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    orderedBoundaries.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         orderedBoundaries.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar2,(long)(pvVar27->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2)
    ;
    pvVar27 = orderedBoundaries.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  orderedBoundaries.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar27;
  this_00 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(this_00,5);
  m.colSettings_ = this_00;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
              *)&m.matrix_,&orderedBoundaries,this_00);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1ba);
  if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
      [m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
              [m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1]->_M_nxt;
    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
    do {
      if (uVar1 == 1) {
        p_Var31 = p_Var31 + 7;
        p_Var29 = p_Var31;
        goto LAB_0015fb26;
      }
      p_Var31 = p_Var31->_M_nxt;
    } while ((p_Var31 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
            (uint)((ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count) ==
            (uint)(m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1)));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var29[2]._M_nxt != 0) {
LAB_0015fb26:
    p_Var29 = p_Var29->_M_nxt;
    if (p_Var29 == p_Var31) break;
  }
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_820 = (undefined **)0x213ac1;
  local_818 = "";
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00255150;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_7e8 = &local_820;
  local_840._0_1_ = p_Var29 == p_Var31;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_830);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x1bb);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar4,0);
  if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff] != (__node_base_ptr)0x0
     ) {
    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var31 = p_Var31 + 7;
        p_Var29 = p_Var31;
        goto LAB_0015fc53;
      }
      p_Var31 = p_Var31->_M_nxt;
    } while ((p_Var31 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
            (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar30));
  }
  std::__throw_out_of_range("_Map_base::at");
  while (*(int *)&p_Var29[2]._M_nxt != 0) {
LAB_0015fc53:
    p_Var29 = p_Var29->_M_nxt;
    if (p_Var29 == p_Var31) break;
  }
  local_840._0_1_ = p_Var29 != p_Var31;
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_820 = (undefined **)0x213ad7;
  local_818 = "";
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00255150;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_7e8 = &local_820;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_830);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1bc);
  if (*m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets == (__node_base_ptr)0x0) {
LAB_00162b4b:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var31 = (*m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets)->_M_nxt;
  uVar1 = *(uint *)&p_Var31[1]._M_nxt;
  while (uVar1 != 0) {
    p_Var31 = p_Var31->_M_nxt;
    if ((p_Var31 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
       (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 0))
    goto LAB_00162b4b;
  }
  local_840._0_1_ = p_Var31[7]._M_nxt == p_Var31 + 7 || p_Var31[7]._M_nxt == (_Hash_node_base *)0x0;
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_820 = (undefined **)0x213aee;
  local_818 = "";
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00255150;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_7e8 = &local_820;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_830);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x1bd);
  if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
      [m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1] == (__node_base_ptr)0x0)
  goto LAB_00162b93;
  p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
            [m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1]->_M_nxt;
  uVar1 = *(uint *)&p_Var31[1]._M_nxt;
  while (uVar1 != 1) {
    p_Var31 = p_Var31->_M_nxt;
    if ((p_Var31 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
       (uint)((ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count) !=
       (uint)(m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1))) {
LAB_00162b93:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_840._0_1_ = p_Var31[7]._M_nxt == p_Var31 + 7 || p_Var31[7]._M_nxt == (_Hash_node_base *)0x0;
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_820 = (undefined **)0x213b02;
  local_818 = "";
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00255150;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_7e8 = &local_820;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_830);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1be);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0);
  if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff] == (__node_base_ptr)0x0
     ) {
LAB_00162b9f:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var31[1]._M_nxt;
  while (uVar1 != 2) {
    p_Var31 = p_Var31->_M_nxt;
    if ((p_Var31 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
       (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar30))
    goto LAB_00162b9f;
  }
  local_840._0_1_ = p_Var31[7]._M_nxt == p_Var31 + 7 || p_Var31[7]._M_nxt == (_Hash_node_base *)0x0;
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_820 = (undefined **)0x213b16;
  local_818 = "";
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00255150;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_7e8 = &local_820;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_830);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x1bf);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff] == (__node_base_ptr)0x0
     ) goto LAB_00162bab;
  p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var31[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var31 = p_Var31->_M_nxt;
    if ((p_Var31 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
       (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar30)) {
LAB_00162bab:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  local_840._0_1_ = p_Var31[7]._M_nxt != p_Var31 + 7 && p_Var31[7]._M_nxt != (_Hash_node_base *)0x0;
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_820 = (undefined **)0x213b2a;
  local_818 = "";
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00255150;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_7e8 = &local_820;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_830);
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x1c0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar7,0);
  if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff] == (__node_base_ptr)0x0
     ) {
LAB_00162bb7:
    std::__throw_out_of_range("_Map_base::at");
  }
  p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var31[1]._M_nxt;
  while (uVar1 != 4) {
    p_Var31 = p_Var31->_M_nxt;
    if ((p_Var31 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
       (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != uVar30))
    goto LAB_00162bb7;
  }
  local_840 = (undefined **)
              CONCAT71(local_840._1_7_,
                       p_Var31[7]._M_nxt != p_Var31 + 7 &&
                       p_Var31[7]._M_nxt != (_Hash_node_base *)0x0);
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_820 = (undefined **)0x213b3f;
  local_818 = "";
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00255150;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_7e8 = &local_820;
  boost::test_tools::tt_detail::report_assertion(&local_840,&local_800,&local_180,0x1c0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_830);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x1c2);
  local_818 = (char *)((ulong)local_818 & 0xffffffffffffff00);
  local_820 = &PTR__lazy_ostream_00254f50;
  local_810 = &boost::unit_test::lazy_ostream::inst;
  local_808 = "";
  local_848 = &local_854;
  local_854 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
  local_7e0[0] = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 5;
  local_858 = 5;
  local_7d8 = 0;
  sStack_7d0.pi_ = (sp_counted_base *)0x0;
  local_7c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_7c0 = "";
  local_7e8 = (undefined ***)&local_848;
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00254ec0;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_828 = &local_850;
  local_838 = local_838 & 0xffffffffffffff00;
  local_840 = &PTR__lazy_ostream_00254f10;
  sStack_830.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_850 = (undefined1 *)&local_858;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_7d0);
  if (((m.colSettings_)->operators).characteristic_ == 0xffffffff) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_01,
               "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
              );
  }
  else {
    this = &m.matrix_.reducedMatrixR_;
    IVar28 = Gudhi::persistence_matrix::
             Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
             ::
             insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                       ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
                         *)this,m.matrix_.reducedMatrixR_.nextInsertIndex_,&boundary1,-1);
    Gudhi::persistence_matrix::
    RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
    ::_insert_boundary(&m.matrix_,IVar28);
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
    ;
    local_1a8 = "";
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x1c4);
    local_818 = (char *)((ulong)local_818 & 0xffffffffffffff00);
    local_820 = &PTR__lazy_ostream_00254f50;
    local_810 = &boost::unit_test::lazy_ostream::inst;
    local_808 = "";
    local_854 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
    local_7e0[0] = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 6;
    local_858 = 6;
    local_7d8 = 0;
    sStack_7d0.pi_ = (sp_counted_base *)0x0;
    local_7c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
    ;
    local_7c0 = "";
    local_848 = &local_854;
    local_7f8 = 0;
    local_800 = &PTR__lazy_ostream_00254ec0;
    local_7f0 = &boost::unit_test::lazy_ostream::inst;
    local_7e8 = (undefined ***)&local_848;
    local_838 = local_838 & 0xffffffffffffff00;
    local_840 = &PTR__lazy_ostream_00254f10;
    sStack_830.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_828 = &local_850;
    local_850 = (undefined1 *)&local_858;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count(&sStack_7d0);
    if (((m.colSettings_)->operators).characteristic_ != 0xffffffff) {
      IVar28 = Gudhi::persistence_matrix::
               Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
               ::
               insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                         ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,false,true>>>
                           *)this,m.matrix_.reducedMatrixR_.nextInsertIndex_,&boundary2,-1);
      Gudhi::persistence_matrix::
      RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
      ::_insert_boundary(&m.matrix_,IVar28);
      local_1d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_1c8 = "";
      local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x1c6);
      local_818 = (char *)((ulong)local_818 & 0xffffffffffffff00);
      local_820 = &PTR__lazy_ostream_00254f50;
      local_810 = &boost::unit_test::lazy_ostream::inst;
      local_808 = "";
      local_854 = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count;
      local_7e0[0] = (int)m.matrix_.reducedMatrixR_.matrix_._M_h._M_element_count == 7;
      local_858 = 7;
      local_7d8 = 0;
      sStack_7d0.pi_ = (sp_counted_base *)0x0;
      local_7c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_7c0 = "";
      local_848 = &local_854;
      local_7f8 = 0;
      local_800 = &PTR__lazy_ostream_00254ec0;
      local_7f0 = &boost::unit_test::lazy_ostream::inst;
      local_7e8 = (undefined ***)&local_848;
      local_838 = local_838 & 0xffffffffffffff00;
      local_840 = &PTR__lazy_ostream_00254f10;
      sStack_830.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
      local_828 = &local_850;
      local_850 = (undefined1 *)&local_858;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_7d0);
      local_1f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_1e8 = "";
      local_200 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x1c7);
      if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
          [m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1] == (__node_base_ptr)0x0)
      goto LAB_00162bc3;
      p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                [m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var31[1]._M_nxt;
      while (uVar1 != 1) {
        p_Var31 = p_Var31->_M_nxt;
        if ((p_Var31 == (_Hash_node_base *)0x0) ||
           (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
           (uint)((ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count) !=
           (uint)(m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1))) {
LAB_00162bc3:
          std::__throw_out_of_range("_Map_base::at");
        }
      }
      p_Var31 = p_Var31 + 7;
      p_Var29 = p_Var31;
      do {
        p_Var29 = p_Var29->_M_nxt;
        if (p_Var29 == p_Var31) break;
      } while (*(int *)&p_Var29[2]._M_nxt != 0);
      local_838 = 0;
      sStack_830.pi_ = (sp_counted_base *)0x0;
      local_820 = (undefined **)0x213ac1;
      local_818 = "";
      local_7f8 = 0;
      local_800 = &PTR__lazy_ostream_00255150;
      local_7f0 = &boost::unit_test::lazy_ostream::inst;
      local_210 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_208 = "";
      local_7e8 = &local_820;
      local_840._0_1_ = p_Var29 == p_Var31;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_830);
      local_220 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_218 = "";
      local_230 = &boost::unit_test::basic_cstring<char_const>::null;
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x1c8);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
      uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
      if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff] !=
          (__node_base_ptr)0x0) {
        p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var31[1]._M_nxt;
        do {
          if (uVar1 == 3) {
            p_Var31 = p_Var31 + 7;
            p_Var29 = p_Var31;
            goto LAB_0016082a;
          }
          p_Var31 = p_Var31->_M_nxt;
        } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar30));
      }
      std::__throw_out_of_range("_Map_base::at");
    }
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_01,
               "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
              );
  }
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  while (*(int *)&p_Var29[2]._M_nxt != 0) {
LAB_0016082a:
    p_Var29 = p_Var29->_M_nxt;
    if (p_Var29 == p_Var31) break;
  }
  local_840._0_1_ = p_Var29 != p_Var31;
  local_838 = 0;
  sStack_830.pi_ = (sp_counted_base *)0x0;
  local_820 = (undefined **)0x213ad7;
  local_818 = "";
  local_7f8 = 0;
  local_800 = &PTR__lazy_ostream_00255150;
  local_7f0 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_7e8 = &local_820;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_830);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x1c9);
  if (*m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets != (__node_base_ptr)0x0) {
    p_Var31 = (*m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets)->_M_nxt;
    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
    do {
      if (uVar1 == 0) {
        local_840._0_1_ =
             p_Var31[7]._M_nxt == p_Var31 + 7 || p_Var31[7]._M_nxt == (_Hash_node_base *)0x0;
        local_838 = 0;
        sStack_830.pi_ = (sp_counted_base *)0x0;
        local_820 = (undefined **)0x213aee;
        local_818 = "";
        local_7f8 = 0;
        local_800 = &PTR__lazy_ostream_00255150;
        local_7f0 = &boost::unit_test::lazy_ostream::inst;
        local_270 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_268 = "";
        local_7e8 = &local_820;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_830);
        local_280 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_278 = "";
        local_290 = &boost::unit_test::basic_cstring<char_const>::null;
        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x1ca);
        if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
            [m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1] != (__node_base_ptr)0x0) {
          p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                    [m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1]->_M_nxt;
          uVar1 = *(uint *)&p_Var31[1]._M_nxt;
          do {
            if (uVar1 == 1) {
              local_840._0_1_ =
                   p_Var31[7]._M_nxt == p_Var31 + 7 || p_Var31[7]._M_nxt == (_Hash_node_base *)0x0;
              local_838 = 0;
              sStack_830.pi_ = (sp_counted_base *)0x0;
              local_820 = (undefined **)0x213b02;
              local_818 = "";
              local_7f8 = 0;
              local_800 = &PTR__lazy_ostream_00255150;
              local_7f0 = &boost::unit_test::lazy_ostream::inst;
              local_2a0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_298 = "";
              local_7e8 = &local_820;
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_830);
              local_2b0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_2a8 = "";
              local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x1cb);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
              uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar9,0);
              if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff] !=
                  (__node_base_ptr)0x0) {
                p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff]->
                          _M_nxt;
                uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                do {
                  if (uVar1 == 2) {
                    local_840._0_1_ =
                         p_Var31[7]._M_nxt == p_Var31 + 7 ||
                         p_Var31[7]._M_nxt == (_Hash_node_base *)0x0;
                    local_838 = 0;
                    sStack_830.pi_ = (sp_counted_base *)0x0;
                    local_820 = (undefined **)0x213b16;
                    local_818 = "";
                    local_7f8 = 0;
                    local_800 = &PTR__lazy_ostream_00255150;
                    local_7f0 = &boost::unit_test::lazy_ostream::inst;
                    local_2d0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_2c8 = "";
                    local_7e8 = &local_820;
                    boost::test_tools::tt_detail::report_assertion();
                    boost::detail::shared_count::~shared_count(&sStack_830);
                    local_2e0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_2d8 = "";
                    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,
                               0x1cc);
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
                    uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
                    if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff] !=
                        (__node_base_ptr)0x0) {
                      p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                                [uVar30 & 0xffffffff]->_M_nxt;
                      uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                      do {
                        if (uVar1 == 3) {
                          local_840._0_1_ =
                               p_Var31[7]._M_nxt != p_Var31 + 7 &&
                               p_Var31[7]._M_nxt != (_Hash_node_base *)0x0;
                          local_838 = 0;
                          sStack_830.pi_ = (sp_counted_base *)0x0;
                          local_820 = (undefined **)0x213b2a;
                          local_818 = "";
                          local_7f8 = 0;
                          local_800 = &PTR__lazy_ostream_00255150;
                          local_7f0 = &boost::unit_test::lazy_ostream::inst;
                          local_300 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_2f8 = "";
                          local_7e8 = &local_820;
                          boost::test_tools::tt_detail::report_assertion();
                          boost::detail::shared_count::~shared_count(&sStack_830);
                          local_310 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_308 = "";
                          local_320 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_318 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_310,0x1cd);
                          auVar11._8_8_ = 0;
                          auVar11._0_8_ = m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
                          uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar11,0);
                          if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets[uVar30 & 0xffffffff]
                              != (__node_base_ptr)0x0) {
                            p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                                      [uVar30 & 0xffffffff]->_M_nxt;
                            uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                            do {
                              if (uVar1 == 4) {
                                local_840._0_1_ =
                                     p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                     p_Var31[7]._M_nxt != (_Hash_node_base *)0x0;
                                local_838 = 0;
                                sStack_830.pi_ = (sp_counted_base *)0x0;
                                local_820 = (undefined **)0x213b3f;
                                local_818 = "";
                                local_7f8 = 0;
                                local_800 = &PTR__lazy_ostream_00255150;
                                local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                local_330 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_328 = "";
                                local_7e8 = &local_820;
                                boost::test_tools::tt_detail::report_assertion();
                                boost::detail::shared_count::~shared_count(&sStack_830);
                                local_340 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_338 = "";
                                local_350 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_348 = &boost::unit_test::basic_cstring<char_const>::null;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           &local_340,0x1cf);
                                auVar12._8_8_ = 0;
                                auVar12._0_8_ =
                                     m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
                                uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5)) % auVar12,0);
                                if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                                    [uVar30 & 0xffffffff] != (__node_base_ptr)0x0) {
                                  p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                                            [uVar30 & 0xffffffff]->_M_nxt;
                                  uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                  do {
                                    if (uVar1 == 5) {
                                      local_840._0_1_ =
                                           p_Var31[7]._M_nxt == p_Var31 + 7 ||
                                           p_Var31[7]._M_nxt == (_Hash_node_base *)0x0;
                                      local_838 = 0;
                                      sStack_830.pi_ = (sp_counted_base *)0x0;
                                      local_820 = (undefined **)0x213b54;
                                      local_818 = "";
                                      local_7f8 = 0;
                                      local_800 = &PTR__lazy_ostream_00255150;
                                      local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                      local_360 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_358 = "";
                                      local_7e8 = &local_820;
                                      boost::test_tools::tt_detail::report_assertion();
                                      boost::detail::shared_count::~shared_count(&sStack_830);
                                      local_370 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_368 = "";
                                      local_380 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_378 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_370,0x1d3);
                                      auVar13._8_8_ = 0;
                                      auVar13._0_8_ =
                                           m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count;
                                      uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar13,0)
                                      ;
                                      if (m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                                          [uVar30 & 0xffffffff] != (__node_base_ptr)0x0) {
                                        p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                                                  [uVar30 & 0xffffffff]->_M_nxt;
                                        uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                        do {
                                          if (uVar1 == 6) {
                                            local_840 = (undefined **)
                                                        CONCAT71(local_840._1_7_,
                                                                 p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                                                 p_Var31[7]._M_nxt !=
                                                                 (_Hash_node_base *)0x0);
                                            local_838 = 0;
                                            sStack_830.pi_ = (sp_counted_base *)0x0;
                                            local_820 = (undefined **)0x213b68;
                                            local_818 = "";
                                            local_7f8 = 0;
                                            local_800 = &PTR__lazy_ostream_00255150;
                                            local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                            local_390 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                            ;
                                            local_388 = "";
                                            local_7e8 = &local_820;
                                            boost::test_tools::tt_detail::report_assertion
                                                      (&local_840,&local_800,&local_390,0x1d3,1,0,0)
                                            ;
                                            boost::detail::shared_count::~shared_count(&sStack_830);
                                            local_3a0 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                            ;
                                            local_398 = "";
                                            local_3b0 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            local_3a8 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,&local_3a0,0x1d5);
                                            local_818 = (char *)((ulong)local_818 &
                                                                0xffffffffffffff00);
                                            local_820 = &PTR__lazy_ostream_00254f50;
                                            local_810 = &boost::unit_test::lazy_ostream::inst;
                                            local_808 = "";
                                            if (*m.matrix_.reducedMatrixR_.matrix_._M_h._M_buckets
                                                != (__node_base_ptr)0x0) {
                                              p_Var31 = (*m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_buckets)->_M_nxt;
                                              uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                              do {
                                                if (uVar1 == 0) {
                                                  local_854 = *(int *)&p_Var31[4]._M_nxt;
                                                  local_858 = 0;
                                                  local_7e0[0] = local_854 == 0;
                                                  local_7d8 = 0;
                                                  sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                  local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254f10;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1d5,1
                                                             ,2,2,"m.get_column_dimension(0)",
                                                             &local_800,"0",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_3c0 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_3b8 = "";
                                                  local_3d0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_3c8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_3c0,0x1d6);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets
                                                      [m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count != 1] != (__node_base_ptr)0x0
                                                     ) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets
                                                              [m.matrix_.reducedMatrixR_.matrix_.
                                                               _M_h._M_bucket_count != 1]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 1) {
                                                        local_854 = *(int *)&p_Var31[4]._M_nxt;
                                                        local_858 = 0;
                                                        local_7e0[0] = local_854 == 0;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254f10;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1d6,1
                                                             ,2,2,"m.get_column_dimension(1)",
                                                             &local_800,"0",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_3e0 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_3d8 = "";
                                                  local_3f0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_3e8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_3e0,0x1d7);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar14._8_8_ = 0;
                                                  auVar14._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2))
                                                                  % auVar14,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 2) {
                                                        local_854 = *(int *)&p_Var31[4]._M_nxt;
                                                        local_858 = 0;
                                                        local_7e0[0] = local_854 == 0;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254f10;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1d7,1
                                                             ,2,2,"m.get_column_dimension(2)",
                                                             &local_800,"0",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_400 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_3f8 = "";
                                                  local_410 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_408 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_400,0x1d8);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar15._8_8_ = 0;
                                                  auVar15._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3))
                                                                  % auVar15,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 3) {
                                                        local_854 = *(int *)&p_Var31[4]._M_nxt;
                                                        local_858 = 1;
                                                        local_7e0[0] = local_854 == 1;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254f10;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1d8,1
                                                             ,2,2,"m.get_column_dimension(3)",
                                                             &local_800,"1",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_420 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_418 = "";
                                                  local_430 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_428 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_420,0x1d9);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar16._8_8_ = 0;
                                                  auVar16._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4))
                                                                  % auVar16,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 4) {
                                                        local_854 = *(int *)&p_Var31[4]._M_nxt;
                                                        local_858 = 1;
                                                        local_7e0[0] = local_854 == 1;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254f10;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1d9,1
                                                             ,2,2,"m.get_column_dimension(4)",
                                                             &local_800,"1",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_440 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_438 = "";
                                                  local_450 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_448 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_440,0x1da);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar17._8_8_ = 0;
                                                  auVar17._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5))
                                                                  % auVar17,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 5) {
                                                        local_854 = *(int *)&p_Var31[4]._M_nxt;
                                                        local_858 = 1;
                                                        local_7e0[0] = local_854 == 1;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254f10;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1da,1
                                                             ,2,2,"m.get_column_dimension(5)",
                                                             &local_800,"1",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_460 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_458 = "";
                                                  local_470 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_468 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_460,0x1db);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar18._8_8_ = 0;
                                                  auVar18._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6))
                                                                  % auVar18,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 6) {
                                                        local_854 = *(int *)&p_Var31[4]._M_nxt;
                                                        local_858 = 2;
                                                        local_7e0[0] = local_854 == 2;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254f10;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1db,1
                                                             ,2,2,"m.get_column_dimension(6)",
                                                             &local_800,"2",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_480 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_478 = "";
                                                  local_490 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_488 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_480,0x1dd);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  if (*m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_buckets != (__node_base_ptr)0x0) {
                                                    p_Var31 = (*m.matrix_.reducedMatrixR_.matrix_.
                                                                _M_h._M_buckets)->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 0) {
                                                        local_854 = -1;
                                                        if (p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                                            p_Var31[7]._M_nxt !=
                                                            (_Hash_node_base *)0x0) {
                                                          local_854 = *(int *)&p_Var31[8]._M_nxt[2].
                                                                               _M_nxt;
                                                        }
                                                        local_858 = 0xffffffff;
                                                        local_7e0[0] = local_854 == -1;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254ec0;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1dd,1
                                                             ,2,2,"m.get_pivot(0)",&local_800,
                                                                                                                          
                                                  "Matrix::template get_null_value<typename Matrix::ID_index>()"
                                                  ,&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_4a0 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_498 = "";
                                                  local_4b0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_4a8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_4a0,0x1de);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets
                                                      [m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count != 1] != (__node_base_ptr)0x0
                                                     ) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets
                                                              [m.matrix_.reducedMatrixR_.matrix_.
                                                               _M_h._M_bucket_count != 1]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 1) {
                                                        local_854 = -1;
                                                        if (p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                                            p_Var31[7]._M_nxt !=
                                                            (_Hash_node_base *)0x0) {
                                                          local_854 = *(int *)&p_Var31[8]._M_nxt[2].
                                                                               _M_nxt;
                                                        }
                                                        local_858 = 0xffffffff;
                                                        local_7e0[0] = local_854 == -1;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254ec0;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1de,1
                                                             ,2,2,"m.get_pivot(1)",&local_800,
                                                                                                                          
                                                  "Matrix::template get_null_value<typename Matrix::ID_index>()"
                                                  ,&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_4c0 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_4b8 = "";
                                                  local_4d0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_4c8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_4c0,0x1df);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar19._8_8_ = 0;
                                                  auVar19._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2))
                                                                  % auVar19,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 2) {
                                                        local_854 = -1;
                                                        if (p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                                            p_Var31[7]._M_nxt !=
                                                            (_Hash_node_base *)0x0) {
                                                          local_854 = *(int *)&p_Var31[8]._M_nxt[2].
                                                                               _M_nxt;
                                                        }
                                                        local_858 = 0xffffffff;
                                                        local_7e0[0] = local_854 == -1;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254ec0;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1df,1
                                                             ,2,2,"m.get_pivot(2)",&local_800,
                                                                                                                          
                                                  "Matrix::template get_null_value<typename Matrix::ID_index>()"
                                                  ,&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_4e0 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_4d8 = "";
                                                  local_4f0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_4e8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_4e0,0x1e0);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar20._8_8_ = 0;
                                                  auVar20._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3))
                                                                  % auVar20,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 3) {
                                                        local_854 = -1;
                                                        if (p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                                            p_Var31[7]._M_nxt !=
                                                            (_Hash_node_base *)0x0) {
                                                          local_854 = *(int *)&p_Var31[8]._M_nxt[2].
                                                                               _M_nxt;
                                                        }
                                                        local_858 = 1;
                                                        local_7e0[0] = local_854 == 1;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1e0,1
                                                             ,2,2,"m.get_pivot(3)",&local_800,"1",
                                                             &local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_500 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_4f8 = "";
                                                  local_510 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_508 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_500,0x1e1);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar21._8_8_ = 0;
                                                  auVar21._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4))
                                                                  % auVar21,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 4) {
                                                        local_854 = -1;
                                                        if (p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                                            p_Var31[7]._M_nxt !=
                                                            (_Hash_node_base *)0x0) {
                                                          local_854 = *(int *)&p_Var31[8]._M_nxt[2].
                                                                               _M_nxt;
                                                        }
                                                        local_858 = 2;
                                                        local_7e0[0] = local_854 == 2;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1e1,1
                                                             ,2,2,"m.get_pivot(4)",&local_800,"2",
                                                             &local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_520 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_518 = "";
                                                  local_530 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_528 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_520,0x1e3);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar22._8_8_ = 0;
                                                  auVar22._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5))
                                                                  % auVar22,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 5) {
                                                        local_854 = -1;
                                                        if (p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                                            p_Var31[7]._M_nxt !=
                                                            (_Hash_node_base *)0x0) {
                                                          local_854 = *(int *)&p_Var31[8]._M_nxt[2].
                                                                               _M_nxt;
                                                        }
                                                        local_858 = 0xffffffff;
                                                        local_7e0[0] = local_854 == -1;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254ec0;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1e3,1
                                                             ,2,2,"m.get_pivot(5)",&local_800,
                                                                                                                          
                                                  "Matrix::template get_null_value<typename Matrix::ID_index>()"
                                                  ,&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_540 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_538 = "";
                                                  local_550 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_548 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_540,0x1e7);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar23._8_8_ = 0;
                                                  auVar23._0_8_ =
                                                       m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6))
                                                                  % auVar23,0);
                                                  if (m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_buckets[uVar30 & 0xffffffff] !=
                                                      (__node_base_ptr)0x0) {
                                                    p_Var31 = m.matrix_.reducedMatrixR_.matrix_._M_h
                                                              ._M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 6) {
                                                        local_854 = -1;
                                                        if (p_Var31[7]._M_nxt != p_Var31 + 7 &&
                                                            p_Var31[7]._M_nxt !=
                                                            (_Hash_node_base *)0x0) {
                                                          local_854 = *(int *)&p_Var31[8]._M_nxt[2].
                                                                               _M_nxt;
                                                        }
                                                        local_858 = 5;
                                                        local_7e0[0] = local_854 == 5;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1e7,1
                                                             ,2,2,"m.get_pivot(6)",&local_800,"5",
                                                             &local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_560 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_558 = "";
                                                  local_570 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_568 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_560,0x1ea);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  if (m.matrix_.pivotToColumnIndex_._M_h._M_buckets
                                                      [m.matrix_.pivotToColumnIndex_._M_h.
                                                       _M_bucket_count != 1] != (__node_base_ptr)0x0
                                                     ) {
                                                    p_Var31 = m.matrix_.pivotToColumnIndex_._M_h.
                                                              _M_buckets
                                                              [m.matrix_.pivotToColumnIndex_._M_h.
                                                               _M_bucket_count != 1]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 1) {
                                                        local_854 = *(int *)((long)&p_Var31[1].
                                                                                    _M_nxt + 4);
                                                        local_858 = 3;
                                                        local_7e0[0] = local_854 == 3;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1ea,1
                                                             ,2,2,"m.get_column_with_pivot(1)",
                                                             &local_800,"3",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_580 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_578 = "";
                                                  local_590 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_588 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_580,0x1eb);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar24._8_8_ = 0;
                                                  auVar24._0_8_ =
                                                       m.matrix_.pivotToColumnIndex_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2))
                                                                  % auVar24,0);
                                                  if (m.matrix_.pivotToColumnIndex_._M_h._M_buckets
                                                      [uVar30 & 0xffffffff] != (__node_base_ptr)0x0)
                                                  {
                                                    p_Var31 = m.matrix_.pivotToColumnIndex_._M_h.
                                                              _M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 2) {
                                                        local_854 = *(int *)((long)&p_Var31[1].
                                                                                    _M_nxt + 4);
                                                        local_858 = 4;
                                                        local_7e0[0] = local_854 == 4;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1eb,1
                                                             ,2,2,"m.get_column_with_pivot(2)",
                                                             &local_800,"4",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  local_5a0 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_598 = "";
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_5a0,0x1ec);
                                                  local_818 = (char *)((ulong)local_818 &
                                                                      0xffffffffffffff00);
                                                  local_820 = &PTR__lazy_ostream_00254f50;
                                                  local_810 = &boost::unit_test::lazy_ostream::inst;
                                                  local_808 = "";
                                                  auVar25._8_8_ = 0;
                                                  auVar25._0_8_ =
                                                       m.matrix_.pivotToColumnIndex_._M_h.
                                                       _M_bucket_count;
                                                  uVar30 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(5))
                                                                  % auVar25,0);
                                                  if (m.matrix_.pivotToColumnIndex_._M_h._M_buckets
                                                      [uVar30 & 0xffffffff] != (__node_base_ptr)0x0)
                                                  {
                                                    p_Var31 = m.matrix_.pivotToColumnIndex_._M_h.
                                                              _M_buckets[uVar30 & 0xffffffff]->
                                                              _M_nxt;
                                                    uVar1 = *(uint *)&p_Var31[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 5) {
                                                        local_854 = *(int *)((long)&p_Var31[1].
                                                                                    _M_nxt + 4);
                                                        local_858 = 6;
                                                        local_7e0[0] = local_854 == 6;
                                                        local_7d8 = 0;
                                                        sStack_7d0.pi_ = (sp_counted_base *)0x0;
                                                        local_7c8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_7c0 = "";
                                                  local_848 = &local_854;
                                                  local_7f8 = 0;
                                                  local_800 = &PTR__lazy_ostream_00254ec0;
                                                  local_7f0 = &boost::unit_test::lazy_ostream::inst;
                                                  local_7e8 = (undefined ***)&local_848;
                                                  local_838 = local_838 & 0xffffffffffffff00;
                                                  local_840 = &PTR__lazy_ostream_00254f10;
                                                  sStack_830.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_828 = &local_850;
                                                  local_850 = (undefined1 *)&local_858;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (local_7e0,&local_820,&local_7c8,0x1ec,1
                                                             ,2,2,"m.get_column_with_pivot(5)",
                                                             &local_800,"6",&local_840);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_7d0);
                                                  Gudhi::persistence_matrix::
                                                  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
                                                  ::reset(&m.matrix_,m.colSettings_);
                                                  pCVar26 = m.colSettings_;
                                                  if (m.colSettings_ != (Column_settings *)0x0) {
                                                    boost::
                                                  pool<boost::default_user_allocator_malloc_free>::
                                                  purge_memory((
                                                  pool<boost::default_user_allocator_malloc_free> *)
                                                  &(m.colSettings_)->entryConstructor);
                                                  puVar3 = (pCVar26->operators).inverse_.
                                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  if (puVar3 != (pointer)0x0) {
                                                    operator_delete(puVar3,(long)(pCVar26->operators
                                                                                 ).inverse_.
                                                                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)puVar3);
                                                  }
                                                  }
                                                  operator_delete(pCVar26,0x58);
                                                  Gudhi::persistence_matrix::
                                                  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_false,_true>_>_>
                                                  ::~RU_matrix(&m.matrix_);
                                                  if (boundary1.
                                                                                                            
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(boundary1.
                                                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)boundary1.
                                                                                                                
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)boundary1.
                                                                                                                    
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  if (boundary2.
                                                                                                            
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                    operator_delete(boundary2.
                                                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)boundary2.
                                                                                                                
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)boundary2.
                                                                                                                    
                                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                                  }
                                                  std::
                                                  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                                                  ::~vector(&orderedBoundaries);
                                                  return;
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.pivotToColumnIndex_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.pivotToColumnIndex_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (uint)((ulong)uVar1 %
                                                                m.matrix_.pivotToColumnIndex_._M_h.
                                                                _M_bucket_count) ==
                                                          (uint)(m.matrix_.pivotToColumnIndex_._M_h.
                                                                 _M_bucket_count != 1)));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (uint)((ulong)uVar1 %
                                                                m.matrix_.reducedMatrixR_.matrix_.
                                                                _M_h._M_bucket_count) ==
                                                          (uint)(m.matrix_.reducedMatrixR_.matrix_.
                                                                 _M_h._M_bucket_count != 1)));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == 0));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                          _M_bucket_count == uVar30));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var31 = p_Var31->_M_nxt;
                                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                          (uint)((ulong)uVar1 %
                                                                m.matrix_.reducedMatrixR_.matrix_.
                                                                _M_h._M_bucket_count) ==
                                                          (uint)(m.matrix_.reducedMatrixR_.matrix_.
                                                                 _M_h._M_bucket_count != 1)));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                }
                                                p_Var31 = p_Var31->_M_nxt;
                                              } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                      (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                      (ulong)uVar1 %
                                                      m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                      _M_bucket_count == 0));
                                            }
                                            std::__throw_out_of_range("_Map_base::at");
                                          }
                                          p_Var31 = p_Var31->_M_nxt;
                                        } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                                (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                                (ulong)uVar1 %
                                                m.matrix_.reducedMatrixR_.matrix_._M_h.
                                                _M_bucket_count == uVar30));
                                      }
                                      std::__throw_out_of_range("_Map_base::at");
                                    }
                                    p_Var31 = p_Var31->_M_nxt;
                                  } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                          (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                          (ulong)uVar1 %
                                          m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count ==
                                          uVar30));
                                }
                                std::__throw_out_of_range("_Map_base::at");
                              }
                              p_Var31 = p_Var31->_M_nxt;
                            } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                                    (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                                    (ulong)uVar1 %
                                    m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count == uVar30
                                    ));
                          }
                          std::__throw_out_of_range("_Map_base::at");
                        }
                        p_Var31 = p_Var31->_M_nxt;
                      } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                              (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                              (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count
                              == uVar30));
                    }
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var31 = p_Var31->_M_nxt;
                } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                        (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                        (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count ==
                        uVar30));
              }
              std::__throw_out_of_range("_Map_base::at");
            }
            p_Var31 = p_Var31->_M_nxt;
          } while ((p_Var31 != (_Hash_node_base *)0x0) &&
                  (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
                  (uint)((ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count) ==
                  (uint)(m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count != 1)));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var31 = p_Var31->_M_nxt;
    } while ((p_Var31 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var31[1]._M_nxt,
            (ulong)uVar1 % m.matrix_.reducedMatrixR_.matrix_._M_h._M_bucket_count == 0));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_boundary_insertion() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  Matrix m(orderedBoundaries, 5);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));

  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 5);
  m.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  m.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  BOOST_CHECK(m.is_zero_entry(1, 0));
  BOOST_CHECK(!m.is_zero_entry(3, 0));
  BOOST_CHECK(m.is_zero_column(0));
  BOOST_CHECK(m.is_zero_column(1));
  BOOST_CHECK(m.is_zero_column(2));
  BOOST_CHECK(!m.is_zero_column(3));
  BOOST_CHECK(!m.is_zero_column(4));
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK(m.is_zero_column(5));  // was reduced
  } else {
    BOOST_CHECK(!m.is_zero_column(5));  // not reduced
  }
  BOOST_CHECK(!m.is_zero_column(6));

  BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
  BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

  BOOST_CHECK_EQUAL(m.get_pivot(0), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(1), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(2), Matrix::template get_null_value<typename Matrix::ID_index>());
  BOOST_CHECK_EQUAL(m.get_pivot(3), 1);
  BOOST_CHECK_EQUAL(m.get_pivot(4), 2);
  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_pivot(5), Matrix::template get_null_value<typename Matrix::ID_index>());  // was reduced
  } else {
    BOOST_CHECK_EQUAL(m.get_pivot(5), 2);  // not reduced
  }
  BOOST_CHECK_EQUAL(m.get_pivot(6), 5);

  if constexpr (is_RU<Matrix>()) {
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 6);
  }
}